

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap128.c
# Opt level: O0

size_t CRYPTO_128_wrap_pad(void *key,uchar *icv,uchar *out,uchar *in,size_t inlen,block128_f block)

{
  undefined1 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  void *in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  block128_f in_R8;
  code *in_R9;
  int ret;
  uchar aiv [8];
  size_t padding_len;
  size_t padded_len;
  size_t blocks_padded;
  int local_5c;
  undefined4 local_58;
  void *in_stack_fffffffffffffff8;
  size_t sVar5;
  
  __n = ((ulong)(in_R8 + 7) & 0xfffffffffffffff8) - (long)in_R8;
  if ((in_R8 == (block128_f)0x0) || ((block128_f)0x7fffffff < in_R8)) {
    sVar5 = 0;
  }
  else {
    if (in_RSI == (uchar *)0x0) {
      local_58 = 0xa65959a6;
    }
    else {
      local_58 = *(undefined4 *)in_RSI;
    }
    uVar2 = (ulong)in_R8 >> 0x18;
    uVar3 = (ulong)in_R8 >> 0x10;
    uVar4 = (ulong)in_R8 >> 8;
    uVar1 = SUB81(in_R8,0);
    if (((ulong)(in_R8 + 7) & 0xfffffffffffffff8) == 8) {
      memmove(in_RDX + 8,in_RCX,(size_t)in_R8);
      *(ulong *)in_RDX =
           CONCAT17(uVar1,CONCAT16((char)uVar4,CONCAT15((char)uVar3,CONCAT14((char)uVar2,local_58)))
                   );
      memset(in_RDX + 8 + (long)in_R8,0,__n);
      (*in_R9)(in_RDX,in_RDX,in_RDI);
      local_5c = 0x10;
    }
    else {
      memmove(in_RDX,in_RCX,(size_t)in_R8);
      memset(in_RDX + (long)in_R8,0,__n);
      sVar5 = CRYPTO_128_wrap(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,(size_t)in_RCX,in_R8);
      local_5c = (int)sVar5;
    }
    sVar5 = (size_t)local_5c;
  }
  return sVar5;
}

Assistant:

size_t CRYPTO_128_wrap_pad(void *key, const unsigned char *icv,
                           unsigned char *out,
                           const unsigned char *in, size_t inlen,
                           block128_f block)
{
    /* n: number of 64-bit blocks in the padded key data
     *
     * If length of plain text is not a multiple of 8, pad the plain text octet
     * string on the right with octets of zeros, where final length is the
     * smallest multiple of 8 that is greater than length of plain text.
     * If length of plain text is a multiple of 8, then there is no padding. */
    const size_t blocks_padded = (inlen + 7) / 8; /* CEILING(m/8) */
    const size_t padded_len = blocks_padded * 8;
    const size_t padding_len = padded_len - inlen;
    /* RFC 5649 section 3: Alternative Initial Value */
    unsigned char aiv[8];
    int ret;

    /* Section 1: use 32-bit fixed field for plaintext octet length */
    if (inlen == 0 || inlen >= CRYPTO128_WRAP_MAX)
        return 0;

    /* Section 3: Alternative Initial Value */
    if (!icv)
        memcpy(aiv, default_aiv, 4);
    else
        memcpy(aiv, icv, 4);    /* Standard doesn't mention this. */

    aiv[4] = (inlen >> 24) & 0xFF;
    aiv[5] = (inlen >> 16) & 0xFF;
    aiv[6] = (inlen >> 8) & 0xFF;
    aiv[7] = inlen & 0xFF;

    if (padded_len == 8) {
        /*
         * Section 4.1 - special case in step 2: If the padded plaintext
         * contains exactly eight octets, then prepend the AIV and encrypt
         * the resulting 128-bit block using AES in ECB mode.
         */
        memmove(out + 8, in, inlen);
        memcpy(out, aiv, 8);
        memset(out + 8 + inlen, 0, padding_len);
        block(out, out, key);
        ret = 16;               /* AIV + padded input */
    } else {
        memmove(out, in, inlen);
        memset(out + inlen, 0, padding_len); /* Section 4.1 step 1 */
        ret = CRYPTO_128_wrap(key, aiv, out, out, padded_len, block);
    }

    return ret;
}